

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_rangeproof_rewind_inner
              (secp256k1_scalar *blind,uint64_t *v,uchar *m,size_t *mlen,secp256k1_scalar *ev,
              secp256k1_scalar *s,size_t *rsizes,size_t rings,uchar *nonce,secp256k1_ge *commit,
              uchar *proof,size_t len,secp256k1_ge *genp)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  secp256k1_scalar *psVar5;
  bool bVar6;
  size_t idx_1;
  size_t idx;
  size_t npub;
  size_t skip2;
  size_t skip1;
  ulong uStack_24a8;
  int b;
  size_t j;
  size_t i;
  size_t offset;
  uint64_t value;
  uchar tmp [32];
  uchar prep [4096];
  secp256k1_scalar stmp;
  secp256k1_scalar sec [32];
  secp256k1_scalar s_orig [128];
  secp256k1_scalar *s_local;
  secp256k1_scalar *ev_local;
  size_t *mlen_local;
  uchar *m_local;
  uint64_t *v_local;
  secp256k1_scalar *blind_local;
  
  offset = 0;
  memset(tmp + 0x18,0,0x1000);
  secp256k1_rangeproof_genrand
            ((secp256k1_scalar *)(stmp.d + 3),(secp256k1_scalar *)(sec[0x1f].d + 3),tmp + 0x18,
             rsizes,rings,nonce,commit,proof,len,genp);
  *v = 0xffffffffffffffff;
  secp256k1_scalar_clear(blind);
  if ((rings == 1) && (*rsizes == 1)) {
    secp256k1_rangeproof_recover_x(blind,(secp256k1_scalar *)(sec[0x1f].d + 3),ev,s);
    if (v != (uint64_t *)0x0) {
      *v = 0;
    }
    if (mlen != (size_t *)0x0) {
      *mlen = 0;
    }
    return 1;
  }
  uStack_24a8 = 0;
  while( true ) {
    if (1 < uStack_24a8) goto LAB_007ad691;
    lVar1 = ((rings - 1) * 4 + rsizes[rings - 1] + -1) - uStack_24a8;
    secp256k1_scalar_get_b32((uchar *)&value,s + lVar1);
    secp256k1_rangeproof_ch32xor((uchar *)&value,prep + lVar1 * 0x20 + -8);
    if (((((byte)value & 0x80) != 0) && (tmp._8_8_ == tmp._16_8_)) && (tmp._0_8_ == tmp._8_8_))
    break;
    uStack_24a8 = uStack_24a8 + 1;
  }
  offset = 0;
  for (j = 0; j < 8; j = j + 1) {
    offset = offset * 0x100 + (ulong)tmp[j + 0x10];
  }
  if (v != (uint64_t *)0x0) {
    *v = offset;
  }
  lVar1 = lVar1 * 0x20;
  *(ulong *)(prep + lVar1 + -8) = CONCAT71(value._1_7_,(byte)value);
  *(undefined8 *)(prep + lVar1) = tmp._0_8_;
  *(undefined8 *)(prep + lVar1 + 8) = tmp._8_8_;
  *(undefined8 *)(prep + lVar1 + 0x10) = tmp._16_8_;
LAB_007ad691:
  if (1 < uStack_24a8) {
    if (mlen != (size_t *)0x0) {
      *mlen = 0;
    }
    return 0;
  }
  uVar2 = (rsizes[rings - 1] - 1) - uStack_24a8;
  uVar3 = offset >> (((char)rings + -1) * '\x02' & 0x3fU) & 3;
  if (uVar2 == uVar3) {
    if (mlen != (size_t *)0x0) {
      *mlen = 0;
    }
    return 0;
  }
  sVar4 = (rings - 1) * 4 + uVar3;
  secp256k1_rangeproof_recover_x
            ((secp256k1_scalar *)(prep + 0xff8),(secp256k1_scalar *)(sec[sVar4 + 0x1f].d + 3),
             ev + sVar4,s + sVar4);
  secp256k1_scalar_negate
            ((secp256k1_scalar *)(sec[rings - 2].d + 3),(secp256k1_scalar *)(sec[rings - 2].d + 3));
  secp256k1_scalar_add
            (blind,(secp256k1_scalar *)(prep + 0xff8),(secp256k1_scalar *)(sec[rings - 2].d + 3));
  if (((m != (uchar *)0x0) && (mlen != (size_t *)0x0)) && (*mlen != 0)) {
    i = 0;
    idx = 0;
    for (j = 0; j < rings; j = j + 1) {
      for (uStack_24a8 = 0; uStack_24a8 < rsizes[j]; uStack_24a8 = uStack_24a8 + 1) {
        if ((idx != (rings - 1) * 4 + uVar2) && (idx != sVar4)) {
          if ((offset >> ((byte)(j << 1) & 0x3f) & 3) == uStack_24a8) {
            secp256k1_rangeproof_recover_k
                      ((secp256k1_scalar *)(prep + 0xff8),(secp256k1_scalar *)(sec[j - 1].d + 3),
                       ev + idx,s + idx);
          }
          else {
            psVar5 = s + idx;
            prep._4088_8_ = psVar5->d[0];
            stmp.d[0] = psVar5->d[1];
            stmp.d[1] = psVar5->d[2];
            stmp.d[2] = psVar5->d[3];
          }
          secp256k1_scalar_get_b32((uchar *)&value,(secp256k1_scalar *)(prep + 0xff8));
          secp256k1_rangeproof_ch32xor((uchar *)&value,prep + idx * 0x20 + -8);
          skip1._4_4_ = 0;
          while( true ) {
            bVar6 = false;
            if (skip1._4_4_ < 0x20) {
              bVar6 = i < *mlen;
            }
            if (!bVar6) break;
            m[i] = tmp[(long)skip1._4_4_ + -8];
            i = i + 1;
            skip1._4_4_ = skip1._4_4_ + 1;
          }
        }
        idx = idx + 1;
      }
    }
    *mlen = i;
    memset(tmp + 0x18,0,0x1000);
    for (j = 0; j < 0x80; j = j + 1) {
      secp256k1_scalar_clear((secp256k1_scalar *)(sec[j + 0x1f].d + 3));
    }
    for (j = 0; j < 0x20; j = j + 1) {
      secp256k1_scalar_clear((secp256k1_scalar *)(sec[j - 1].d + 3));
    }
    secp256k1_scalar_clear((secp256k1_scalar *)(prep + 0xff8));
    return 1;
  }
  if (mlen != (size_t *)0x0) {
    *mlen = 0;
  }
  return 1;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_rewind_inner(secp256k1_scalar *blind, uint64_t *v,
 unsigned char *m, size_t *mlen, secp256k1_scalar *ev, secp256k1_scalar *s,
 size_t *rsizes, size_t rings, const unsigned char *nonce, const secp256k1_ge *commit, const unsigned char *proof, size_t len, const secp256k1_ge *genp) {
    secp256k1_scalar s_orig[128];
    secp256k1_scalar sec[32];
    secp256k1_scalar stmp;
    unsigned char prep[4096];
    unsigned char tmp[32];
    uint64_t value = 0;
    size_t offset;
    size_t i;
    size_t j;
    int b;
    size_t skip1;
    size_t skip2;
    size_t npub;
    npub = ((rings - 1) << 2) + rsizes[rings-1];
    VERIFY_CHECK(npub <= 128);
    VERIFY_CHECK(npub >= 1);
    memset(prep, 0, 4096);
    /* Reconstruct the provers random values. */
    secp256k1_rangeproof_genrand(sec, s_orig, prep, rsizes, rings, nonce, commit, proof, len, genp);
    *v = UINT64_MAX;
    secp256k1_scalar_clear(blind);
    if (rings == 1 && rsizes[0] == 1) {
        /* With only a single proof, we can only recover the blinding factor. */
        secp256k1_rangeproof_recover_x(blind, &s_orig[0], &ev[0], &s[0]);
        if (v) {
            *v = 0;
        }
        if (mlen) {
            *mlen = 0;
        }
        return 1;
    }
    npub = (rings - 1) << 2;
    for (j = 0; j < 2; j++) {
        size_t idx;
        /* Look for a value encoding in the last ring. */
        idx = npub + rsizes[rings - 1] - 1 - j;
        secp256k1_scalar_get_b32(tmp, &s[idx]);
        secp256k1_rangeproof_ch32xor(tmp, &prep[idx * 32]);
        if ((tmp[0] & 128) && (memcmp(&tmp[16], &tmp[24], 8) == 0) && (memcmp(&tmp[8], &tmp[16], 8) == 0)) {
            value = 0;
            for (i = 0; i < 8; i++) {
                value = (value << 8) + tmp[24 + i];
            }
            if (v) {
                *v = value;
            }
            memcpy(&prep[idx * 32], tmp, 32);
            break;
        }
    }
    if (j > 1) {
        /* Couldn't extract a value. */
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 = rsizes[rings - 1] - 1 - j;
    skip2 = ((value >> ((rings - 1) << 1)) & 3);
    if (skip1 == skip2) {
        /*Value is in wrong position.*/
        if (mlen) {
            *mlen = 0;
        }
        return 0;
    }
    skip1 += (rings - 1) << 2;
    skip2 += (rings - 1) << 2;
    /* Like in the rsize[] == 1 case, Having figured out which s is the one which was not forged, we can recover the blinding factor. */
    secp256k1_rangeproof_recover_x(&stmp, &s_orig[skip2], &ev[skip2], &s[skip2]);
    secp256k1_scalar_negate(&sec[rings - 1], &sec[rings - 1]);
    secp256k1_scalar_add(blind, &stmp, &sec[rings - 1]);
    if (!m || !mlen || *mlen == 0) {
        if (mlen) {
            *mlen = 0;
        }
        /* FIXME: cleanup in early out/failure cases. */
        return 1;
    }
    offset = 0;
    npub = 0;
    for (i = 0; i < rings; i++) {
        size_t idx;
        idx = (value >> (i << 1)) & 3;
        for (j = 0; j < rsizes[i]; j++) {
            if (npub == skip1 || npub == skip2) {
                npub++;
                continue;
            }
            if (idx == j) {
                /** For the non-forged signatures the signature is calculated instead of random, instead we recover the prover's nonces.
                 *  this could just as well recover the blinding factors and messages could be put there as is done for recovering the
                 *  blinding factor in the last ring, but it takes an inversion to recover x so it's faster to put the message data in k.
                 */
                secp256k1_rangeproof_recover_k(&stmp, &sec[i], &ev[npub], &s[npub]);
            } else {
                stmp = s[npub];
            }
            secp256k1_scalar_get_b32(tmp, &stmp);
            secp256k1_rangeproof_ch32xor(tmp, &prep[npub * 32]);
            for (b = 0; b < 32 && offset < *mlen; b++) {
                m[offset] = tmp[b];
                offset++;
            }
            npub++;
        }
    }
    *mlen = offset;
    memset(prep, 0, 4096);
    for (i = 0; i < 128; i++) {
        secp256k1_scalar_clear(&s_orig[i]);
    }
    for (i = 0; i < 32; i++) {
        secp256k1_scalar_clear(&sec[i]);
    }
    secp256k1_scalar_clear(&stmp);
    return 1;
}